

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSLSocket.cpp
# Opt level: O1

bool __thiscall blc::network::SSLSocket::readable(SSLSocket *this)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  char tmp;
  timeval timeout;
  fd_set fds;
  undefined1 local_a9;
  timeval local_a8;
  fd_set local_98;
  
  local_a8.tv_sec = 0;
  local_a8.tv_usec = 0;
  if (this->_opened != false) {
    local_98.fds_bits[0xe] = 0;
    local_98.fds_bits[0xf] = 0;
    local_98.fds_bits[0xc] = 0;
    local_98.fds_bits[0xd] = 0;
    local_98.fds_bits[10] = 0;
    local_98.fds_bits[0xb] = 0;
    local_98.fds_bits[8] = 0;
    local_98.fds_bits[9] = 0;
    local_98.fds_bits[6] = 0;
    local_98.fds_bits[7] = 0;
    local_98.fds_bits[4] = 0;
    local_98.fds_bits[5] = 0;
    local_98.fds_bits[2] = 0;
    local_98.fds_bits[3] = 0;
    local_98.fds_bits[0] = 0;
    local_98.fds_bits[1] = 0;
    iVar2 = *(int *)&(this->super_Socket).field_0x44;
    iVar1 = iVar2 + 0x3f;
    if (-1 < iVar2) {
      iVar1 = iVar2;
    }
    local_98.fds_bits[iVar1 >> 6] =
         local_98.fds_bits[iVar1 >> 6] | 1L << ((byte)(iVar2 % 0x40) & 0x3f);
    iVar2 = select(iVar2 + 1,&local_98,(fd_set *)0x0,(fd_set *)0x0,&local_a8);
    if (iVar2 < 1) {
      return false;
    }
    sVar3 = recv(*(int *)&(this->super_Socket).field_0x44,&local_a9,1,0x42);
    if (sVar3 != 0) {
      return true;
    }
    (*(this->super_Socket).super_stream._vptr_stream[3])(this);
  }
  return false;
}

Assistant:

bool blc::network::SSLSocket::readable() const {
	fd_set		fds;
	struct timeval	timeout = {0, 0};
	char		tmp;

	if (this->_opened == false)
		return (false);
	FD_ZERO(&fds);
	FD_SET(this->_socket, &fds);
	if (select(this->_socket + 1, &fds, 0, 0, &timeout) <= 0)
		return (false);
	if (::recv(this->_socket, &tmp, 1, MSG_PEEK | MSG_DONTWAIT) == 0) {
		const_cast<blc::network::SSLSocket *>(this)->close();
		return (false);
	}
	return (true);
}